

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int gz_avail(gz_statep state)

{
  uInt *puVar1;
  uInt uVar2;
  uchar *puVar3;
  Bytef *pBVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined8 in_RAX;
  long lVar8;
  uint got;
  
  got = (uint)((ulong)in_RAX >> 0x20);
  if (((state->err == 0) || (iVar7 = -1, state->err == -5)) && (iVar7 = 0, state->eof == 0)) {
    uVar2 = (state->strm).avail_in;
    if (uVar2 == 0) {
      uVar5 = 0;
    }
    else {
      puVar3 = state->in;
      pBVar4 = (state->strm).next_in;
      lVar8 = 0;
      do {
        puVar3[lVar8] = pBVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (uVar2 != (uInt)lVar8);
      uVar5 = (state->strm).avail_in;
    }
    iVar6 = gz_load(state,state->in + uVar5,state->size - uVar5,&got);
    iVar7 = -1;
    if (iVar6 != -1) {
      puVar1 = &(state->strm).avail_in;
      *puVar1 = *puVar1 + got;
      (state->strm).next_in = state->in;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

local int gz_avail(state)
    gz_statep state;
{
    unsigned got;
    z_streamp strm = &(state->strm);

    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;
    if (state->eof == 0) {
        if (strm->avail_in) {       /* copy what's there to the start */
            unsigned char *p = state->in;
            unsigned const char *q = strm->next_in;
            unsigned n = strm->avail_in;
            do {
                *p++ = *q++;
            } while (--n);
        }
        if (gz_load(state, state->in + strm->avail_in,
                    state->size - strm->avail_in, &got) == -1)
            return -1;
        strm->avail_in += got;
        strm->next_in = state->in;
    }
    return 0;
}